

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::BlendA64MaskTestHBD_d16_ExtremeValues_Test::
~BlendA64MaskTestHBD_d16_ExtremeValues_Test(BlendA64MaskTestHBD_d16_ExtremeValues_Test *this)

{
  void *in_RDI;
  
  ~BlendA64MaskTestHBD_d16_ExtremeValues_Test
            ((BlendA64MaskTestHBD_d16_ExtremeValues_Test *)0xa91938);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST_P(BlendA64MaskTestHBD_d16, ExtremeValues) {
  for (bit_depth_ = 8; bit_depth_ <= 12; bit_depth_ += 2) {
    src_max_bits_mask_ =
        (bit_depth_ == 8) ? kSrcMaxBitsMask : kSrcMaxBitsMaskHBD;

    for (int i = 0; i < kBufSize; ++i) {
      dst_ref_[i] = 0;
      dst_tst_[i] = (1 << bit_depth_) - 1;

      src0_[i] = src_max_bits_mask_;
      src1_[i] = src_max_bits_mask_;
    }

    for (int i = 0; i < kMaxMaskSize; ++i) mask_[i] = AOM_BLEND_A64_MAX_ALPHA;
    for (int bsize = 0; bsize < BLOCK_SIZES_ALL; ++bsize) {
      RunTest(bsize, 1);
    }
  }
}